

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_scalarmult(ge_p2 *r,uint8_t *scalar,ge_p3 *A)

{
  crypto_word_t cVar1;
  ulong uVar2;
  undefined1 local_fd8 [8];
  ge_cached selected;
  uint j;
  uint8_t index;
  ge_p3 u;
  undefined1 local_e88 [4];
  uint i;
  ge_p1p1 t;
  ge_cached Ai [16];
  ge_p2 Ai_p2 [8];
  ge_p3 *A_local;
  uint8_t *scalar_local;
  ge_p2 *r_local;
  
  ge_cached_0((ge_cached *)(t.T.v + 4));
  x25519_ge_p3_to_cached((ge_cached *)(Ai[0].T2d.v + 4),A);
  ge_p3_to_p2((ge_p2 *)(Ai_p2[0].Z.v + 4),A);
  for (u.T.v[4]._4_4_ = 2; u.T.v[4]._4_4_ < 0x10; u.T.v[4]._4_4_ = u.T.v[4]._4_4_ + 2) {
    ge_p2_dbl((ge_p1p1 *)local_e88,(ge_p2 *)(Ai_p2[(ulong)(u.T.v[4]._4_4_ >> 1) - 1].Z.v + 4));
    ge_p1p1_to_cached((ge_cached *)(Ai[(ulong)u.T.v[4]._4_4_ - 1].T2d.v + 4),(ge_p1p1 *)local_e88);
    if (u.T.v[4]._4_4_ < 8) {
      x25519_ge_p1p1_to_p2((ge_p2 *)(Ai_p2[(ulong)u.T.v[4]._4_4_ - 1].Z.v + 4),(ge_p1p1 *)local_e88)
      ;
    }
    x25519_ge_add((ge_p1p1 *)local_e88,A,(ge_cached *)(Ai[(ulong)u.T.v[4]._4_4_ - 1].T2d.v + 4));
    ge_p1p1_to_cached((ge_cached *)(Ai[(ulong)(u.T.v[4]._4_4_ + 1) - 1].T2d.v + 4),
                      (ge_p1p1 *)local_e88);
    if (u.T.v[4]._4_4_ < 7) {
      x25519_ge_p1p1_to_p2
                ((ge_p2 *)(Ai_p2[(ulong)(u.T.v[4]._4_4_ + 1) - 1].Z.v + 4),(ge_p1p1 *)local_e88);
    }
  }
  ge_p2_0(r);
  for (u.T.v[4]._4_4_ = 0; u.T.v[4]._4_4_ < 0x100; u.T.v[4]._4_4_ = u.T.v[4]._4_4_ + 4) {
    ge_p2_dbl((ge_p1p1 *)local_e88,r);
    x25519_ge_p1p1_to_p2(r,(ge_p1p1 *)local_e88);
    ge_p2_dbl((ge_p1p1 *)local_e88,r);
    x25519_ge_p1p1_to_p2(r,(ge_p1p1 *)local_e88);
    ge_p2_dbl((ge_p1p1 *)local_e88,r);
    x25519_ge_p1p1_to_p2(r,(ge_p1p1 *)local_e88);
    ge_p2_dbl((ge_p1p1 *)local_e88,r);
    x25519_ge_p1p1_to_p3((ge_p3 *)&j,(ge_p1p1 *)local_e88);
    selected.T2d.v[4]._7_1_ =
         (byte)((int)(uint)scalar[0x1f - (u.T.v[4]._4_4_ >> 3)] >>
               (4 - ((byte)u.T.v[4]._4_4_ & 4) & 0x1f)) & 0xf;
    ge_cached_0((ge_cached *)local_fd8);
    for (selected.T2d.v[4]._0_4_ = 0; (uint)selected.T2d.v[4] < 0x10;
        selected.T2d.v[4]._0_4_ = (uint)selected.T2d.v[4] + 1) {
      uVar2 = (ulong)(uint)selected.T2d.v[4];
      cVar1 = constant_time_eq_w((ulong)selected.T2d.v[4]._7_1_,(ulong)(uint)selected.T2d.v[4]);
      cmov_cached((ge_cached *)local_fd8,(ge_cached *)(Ai[uVar2 - 1].T2d.v + 4),(byte)cVar1 & 1);
    }
    x25519_ge_add((ge_p1p1 *)local_e88,(ge_p3 *)&j,(ge_cached *)local_fd8);
    x25519_ge_p1p1_to_p2(r,(ge_p1p1 *)local_e88);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult(ge_p2 *r, const uint8_t *scalar, const ge_p3 *A) {
  ge_p2 Ai_p2[8];
  ge_cached Ai[16];
  ge_p1p1 t;

  ge_cached_0(&Ai[0]);
  x25519_ge_p3_to_cached(&Ai[1], A);
  ge_p3_to_p2(&Ai_p2[1], A);

  unsigned i;
  for (i = 2; i < 16; i += 2) {
    ge_p2_dbl(&t, &Ai_p2[i / 2]);
    ge_p1p1_to_cached(&Ai[i], &t);
    if (i < 8) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i], &t);
    }
    x25519_ge_add(&t, A, &Ai[i]);
    ge_p1p1_to_cached(&Ai[i + 1], &t);
    if (i < 7) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i + 1], &t);
    }
  }

  ge_p2_0(r);
  ge_p3 u;

  for (i = 0; i < 256; i += 4) {
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p3(&u, &t);

    uint8_t index = scalar[31 - i / 8];
    index >>= 4 - (i & 4);
    index &= 0xf;

    unsigned j;
    ge_cached selected;
    ge_cached_0(&selected);
    for (j = 0; j < 16; j++) {
      cmov_cached(&selected, &Ai[j], 1 & constant_time_eq_w(index, j));
    }

    x25519_ge_add(&t, &u, &selected);
    x25519_ge_p1p1_to_p2(r, &t);
  }
}